

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall
TTD::EventLog::RecordJsRTCreateTypeError
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var msg)

{
  EventLogEntry *pEVar1;
  JsRTVarsArgumentAction_InternalUse<1UL> *local_28;
  JsRTSingleVarArgumentAction *sAction;
  
  local_28 = (JsRTVarsArgumentAction_InternalUse<1UL> *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
                     (this,&local_28);
  local_28->VarArray[0] = msg;
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = pEVar1;
    actionPopper->m_resultPtr = &local_28->Result;
    local_28->Result = (TTDVar)0x0;
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

void EventLog::RecordJsRTCreateTypeError(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var msg)
    {
        NSLogEvents::JsRTSingleVarArgumentAction* sAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTSingleVarArgumentAction, NSLogEvents::EventKind::CreateTypeErrorActionTag>(&sAction);
        NSLogEvents::SetVarItem_0(sAction, TTD_CONVERT_JSVAR_TO_TTDVAR(msg));

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(sAction->Result));
    }